

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

bool Utilities::parseNumber<double>(string *s,double *x)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  stringstream local_1d0 [8];
  stringstream ss;
  int local_44;
  double dStack_40;
  int n;
  double f;
  double dStack_30;
  bool neg;
  double r;
  char *p;
  double *x_local;
  string *s_local;
  
  r = (double)std::__cxx11::string::c_str();
  dStack_30 = 0.0;
  cVar1 = *(char *)r;
  if (cVar1 == '-') {
    r = (double)((long)r + 1);
  }
  while( true ) {
    bVar2 = false;
    if ('/' < *(char *)r) {
      bVar2 = *(char *)r < ':';
    }
    if (!bVar2) break;
    dStack_30 = dStack_30 * 10.0 + (double)(*(char *)r + -0x30);
    r = (double)((long)r + 1);
  }
  if (*(char *)r == '.') {
    dStack_40 = 0.0;
    local_44 = 0;
    while( true ) {
      r = (double)((long)r + 1);
      bVar2 = false;
      if ('/' < *(char *)r) {
        bVar2 = *(char *)r < ':';
      }
      if (!bVar2) break;
      dStack_40 = dStack_40 * 10.0 + (double)(*(char *)r + -0x30);
      local_44 = local_44 + 1;
    }
    for (; 0 < local_44; local_44 = local_44 + -1) {
      dStack_40 = dStack_40 / 10.0;
    }
    dStack_30 = dStack_40 + dStack_30;
  }
  if (cVar1 == '-') {
    dStack_30 = -dStack_30;
  }
  *x = dStack_30;
  if (*(char *)r == '\0') {
    s_local._7_1_ = true;
  }
  else {
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1d0,(string *)s,_Var4);
    std::istream::operator>>(local_1d0,x);
    bVar3 = std::ios::fail();
    s_local._7_1_ = (bool)((bVar3 ^ 0xff) & 1);
    std::__cxx11::stringstream::~stringstream(local_1d0);
  }
  return s_local._7_1_;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }